

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

void Gia_ManPerformOneIter(Gia_ManEra_t *p)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_ManEra_t *p_local;
  
  local_1c = 1;
  while( true ) {
    bVar2 = false;
    if (local_1c < p->pAig->nObjs) {
      pGStack_18 = Gia_ManObj(p->pAig,local_1c);
      bVar2 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(pGStack_18);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_18);
      if (iVar1 != 0) {
        Gia_ManSimulateCo(p,pGStack_18);
      }
    }
    else {
      Gia_ManSimulateNode(p,pGStack_18);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_ManPerformOneIter( Gia_ManEra_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManSimulateNode( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManSimulateCo( p, pObj );
    }
}